

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O2

Sequence * __thiscall kratos::Sequence::imply(Sequence *this,shared_ptr<kratos::Var> *var)

{
  Sequence *pSVar1;
  __shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::make_shared<kratos::Sequence,std::shared_ptr<kratos::Var>const&>
            ((shared_ptr<kratos::Var> *)&local_28);
  std::__shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->next_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>,
             &local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  pSVar1 = (this->next_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pSVar1->parent_ = this;
  return pSVar1;
}

Assistant:

Sequence *Sequence::imply(const std::shared_ptr<Var> &var) {
    next_ = std::make_shared<Sequence>(var);
    next_->parent_ = this;
    return next_.get();
}